

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseNameAndCompare(xmlParserCtxtPtr ctxt,xmlChar *other)

{
  bool bVar1;
  xmlChar *ret;
  xmlChar *in;
  xmlChar *cmp;
  xmlChar *other_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (ctxt->instate == XML_PARSER_EOF) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    ret = ctxt->input->cur;
    in = other;
    while( true ) {
      bVar1 = false;
      if (*ret != '\0') {
        bVar1 = *ret == *in;
      }
      if (!bVar1) break;
      ret = ret + 1;
      in = in + 1;
    }
    if ((*in == '\0') &&
       ((((*ret == '>' || (*ret == ' ')) || ((8 < *ret && (*ret < 0xb)))) || (*ret == '\r')))) {
      ctxt->input->col = ctxt->input->col + ((int)ret - (int)ctxt->input->cur);
      ctxt->input->cur = ret;
      ctxt_local = (xmlParserCtxtPtr)0x1;
    }
    else {
      ctxt_local = (xmlParserCtxtPtr)xmlParseName(ctxt);
      if (ctxt_local == (xmlParserCtxtPtr)other) {
        ctxt_local = (xmlParserCtxtPtr)0x1;
      }
    }
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static const xmlChar *
xmlParseNameAndCompare(xmlParserCtxtPtr ctxt, xmlChar const *other) {
    register const xmlChar *cmp = other;
    register const xmlChar *in;
    const xmlChar *ret;

    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        return(NULL);

    in = ctxt->input->cur;
    while (*in != 0 && *in == *cmp) {
	++in;
	++cmp;
    }
    if (*cmp == 0 && (*in == '>' || IS_BLANK_CH (*in))) {
	/* success */
	ctxt->input->col += in - ctxt->input->cur;
	ctxt->input->cur = in;
	return (const xmlChar*) 1;
    }
    /* failure (or end of input buffer), check with full function */
    ret = xmlParseName (ctxt);
    /* strings coming from the dictionary direct compare possible */
    if (ret == other) {
	return (const xmlChar*) 1;
    }
    return ret;
}